

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O0

void cf2_freeT1SeacComponent(PS_Decoder *decoder,CF2_Buffer buf)

{
  undefined1 local_30 [8];
  FT_Data data;
  T1_Face face;
  CF2_Buffer buf_local;
  PS_Decoder *decoder_local;
  
  data._8_8_ = (decoder->builder).face;
  local_30 = (undefined1  [8])buf->start;
  data.pointer._0_4_ = (int)buf->end - (int)buf->start;
  if (((FT_Face)data._8_8_)->internal->incremental_interface != (FT_Incremental_InterfaceRec *)0x0)
  {
    (*((FT_Face)data._8_8_)->internal->incremental_interface->funcs->free_glyph_data)
              (((FT_Face)data._8_8_)->internal->incremental_interface->object,(FT_Data *)local_30);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_freeT1SeacComponent( PS_Decoder*  decoder,
                           CF2_Buffer   buf )
  {
    T1_Face  face;
    FT_Data  data;


    FT_ASSERT( decoder );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    face = (T1_Face)decoder->builder.face;

    data.pointer = buf->start;
    data.length  = (FT_Int)( buf->end - buf->start );

    if ( face->root.internal->incremental_interface )
      face->root.internal->incremental_interface->funcs->free_glyph_data(
        face->root.internal->incremental_interface->object,
        &data );
#endif /* FT_CONFIG_OPTION_INCREMENTAL */
  }